

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O2

int AF_A_FirePlasma(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  player_t *player;
  AWeapon *this_00;
  bool bVar2;
  uint uVar3;
  void *pvVar4;
  FState *flashstate;
  PClassActor *type;
  AActor *source;
  char *__assertion;
  FName local_2c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00521792;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00521782;
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_00521658;
    bVar2 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00521792;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_00521782;
LAB_00521658:
    source = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_00521782:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_00521792;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00521792;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_00521782;
    }
    if ((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar4 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_005216dc;
        if (pvVar4 == (void *)0x0) goto LAB_005216da;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_00521792:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x202,"int AF_A_FirePlasma(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_005216da:
  pvVar4 = (void *)0x0;
LAB_005216dc:
  player = source->player;
  if (player != (player_t *)0x0) {
    this_00 = player->ReadyWeapon;
    if ((pvVar4 != (void *)0x0 && this_00 != (AWeapon *)0x0) && (*(int *)((long)pvVar4 + 8) == 1)) {
      bVar2 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,1);
      if (!bVar2) {
        return 0;
      }
      local_2c.Index = 0xa3;
      flashstate = AActor::FindState((AActor *)this_00,&local_2c);
      if (flashstate != (FState *)0x0) {
        uVar3 = FRandom::operator()(&pr_fireplasma);
        P_SetSafeFlash(this_00,player,flashstate,uVar3 & 1);
      }
    }
    type = PClass::FindActor("PlasmaBall");
    P_SpawnPlayerMissile(source,type);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePlasma)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;

		FState *flash = weapon->FindState(NAME_Flash);
		if (flash != NULL)
		{
			P_SetSafeFlash(weapon, player, flash, (pr_fireplasma()&1));
		}
	}

	P_SpawnPlayerMissile (self, PClass::FindActor("PlasmaBall"));
	return 0;
}